

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperOffset::DoOffset(ClipperOffset *this,double delta)

{
  long lVar1;
  int iVar2;
  int iVar3;
  reference ppPVar4;
  size_type sVar5;
  reference pvVar6;
  cInt cVar7;
  cInt cVar8;
  reference pvVar9;
  reference pvVar10;
  double dVar11;
  IntPoint local_1d8;
  IntPoint local_1c8;
  int local_1b4;
  undefined1 auStack_1b0 [4];
  int j_11;
  double local_1a8;
  DoublePoint local_1a0;
  int local_18c;
  undefined1 auStack_188 [4];
  int j_10;
  double local_180;
  int local_174;
  undefined1 auStack_170 [4];
  int j_9;
  cInt local_168;
  IntPoint local_160;
  int local_14c;
  undefined1 auStack_148 [4];
  int j_8;
  IntPoint pt1;
  int local_130;
  int j_7;
  int k_2;
  int j_6;
  double local_120;
  DoublePoint local_118;
  int local_104;
  double dStack_100;
  int j_5;
  DoublePoint n;
  int j_4;
  int k_1;
  int j_3;
  int k;
  double local_d8;
  DoublePoint local_d0;
  DoublePoint local_c0;
  int local_ac;
  undefined1 local_a8 [4];
  int j_2;
  int local_94;
  double dStack_90;
  int j_1;
  double Y_1;
  double X_1;
  double X2;
  long local_68;
  cInt j;
  double Y;
  double X;
  value_type pPStack_48;
  int len;
  PolyNode *node_1;
  double dStack_38;
  int i_1;
  double steps;
  double y;
  PolyNode *node;
  double dStack_18;
  int i;
  double delta_local;
  ClipperOffset *this_local;
  
  dStack_18 = delta;
  delta_local = (double)this;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear(&this->m_destPolys);
  this->m_delta = dStack_18;
  if ((dStack_18 <= -1e-20) || (1e-20 <= dStack_18)) {
    if (this->MiterLimit <= 2.0) {
      this->m_miterLim = 0.5;
    }
    else {
      this->m_miterLim = 2.0 / (this->MiterLimit * this->MiterLimit);
    }
    if (0.0 < this->ArcTolerance) {
      if (this->ArcTolerance <= ABS(dStack_18) * 0.25) {
        steps = this->ArcTolerance;
      }
      else {
        steps = ABS(dStack_18) * 0.25;
      }
    }
    else {
      steps = 0.25;
    }
    dStack_38 = acos(1.0 - steps / ABS(dStack_18));
    dStack_38 = 3.141592653589793 / dStack_38;
    if (ABS(dStack_18) * 3.141592653589793 < dStack_38) {
      dStack_38 = ABS(dStack_18) * 3.141592653589793;
    }
    dVar11 = sin(6.283185307179586 / dStack_38);
    this->m_sin = dVar11;
    dVar11 = cos(6.283185307179586 / dStack_38);
    this->m_cos = dVar11;
    this->m_StepsPerRad = dStack_38 / 6.283185307179586;
    if (dStack_18 < 0.0) {
      this->m_sin = -this->m_sin;
    }
    iVar2 = PolyNode::ChildCount(&this->m_polyNodes);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::reserve(&this->m_destPolys,(long)(iVar2 << 1));
    for (node_1._4_4_ = 0; iVar2 = node_1._4_4_, iVar3 = PolyNode::ChildCount(&this->m_polyNodes),
        iVar2 < iVar3; node_1._4_4_ = node_1._4_4_ + 1) {
      ppPVar4 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
                operator[](&(this->m_polyNodes).Childs,(long)node_1._4_4_);
      pPStack_48 = *ppPVar4;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
                (&this->m_srcPoly,&pPStack_48->Contour);
      sVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                        (&this->m_srcPoly);
      X._4_4_ = (int)sVar5;
      if ((X._4_4_ != 0) &&
         ((0.0 < dStack_18 || ((2 < X._4_4_ && (pPStack_48->m_endtype == etClosedPolygon)))))) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::clear
                  (&this->m_destPoly);
        if (X._4_4_ == 1) {
          if (pPStack_48->m_jointype == jtRound) {
            Y = 1.0;
            j = 0;
            for (local_68 = 1; (double)local_68 <= dStack_38; local_68 = local_68 + 1) {
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,0);
              cVar7 = Round(Y * dStack_18 + (double)pvVar6->X);
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,0);
              cVar8 = Round((double)j * dStack_18 + (double)pvVar6->Y);
              IntPoint::IntPoint((IntPoint *)&X2,cVar7,cVar8);
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (&this->m_destPoly,(value_type *)&X2);
              X_1 = Y;
              dVar11 = this->m_sin * (double)j;
              j = (cInt)(Y * this->m_sin + (double)j * this->m_cos);
              Y = Y * this->m_cos + -dVar11;
            }
          }
          else {
            Y_1 = -1.0;
            dStack_90 = -1.0;
            for (local_94 = 0; local_94 < 4; local_94 = local_94 + 1) {
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,0);
              cVar7 = Round(Y_1 * dStack_18 + (double)pvVar6->X);
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,0);
              cVar8 = Round(dStack_90 * dStack_18 + (double)pvVar6->Y);
              IntPoint::IntPoint((IntPoint *)local_a8,cVar7,cVar8);
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (&this->m_destPoly,(value_type *)local_a8);
              if (0.0 <= Y_1) {
                if (0.0 <= dStack_90) {
                  Y_1 = -1.0;
                }
                else {
                  dStack_90 = 1.0;
                }
              }
              else {
                Y_1 = 1.0;
              }
            }
          }
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(&this->m_destPolys,&this->m_destPoly);
        }
        else {
          std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::clear
                    (&this->m_normals);
          std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::reserve
                    (&this->m_normals,(long)X._4_4_);
          for (local_ac = 0; local_ac < X._4_4_ + -1; local_ac = local_ac + 1) {
            pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                     operator[](&this->m_srcPoly,(long)local_ac);
            pvVar9 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                     operator[](&this->m_srcPoly,(long)(local_ac + 1));
            local_c0 = GetUnitNormal(pvVar6,pvVar9);
            std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
            push_back(&this->m_normals,&local_c0);
          }
          if ((pPStack_48->m_endtype == etClosedLine) || (pPStack_48->m_endtype == etClosedPolygon))
          {
            pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                     operator[](&this->m_srcPoly,(long)(X._4_4_ + -1));
            pvVar9 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                     operator[](&this->m_srcPoly,0);
            local_d0 = GetUnitNormal(pvVar6,pvVar9);
            std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
            push_back(&this->m_normals,&local_d0);
          }
          else {
            pvVar10 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ::operator[](&this->m_normals,(long)(X._4_4_ + -2));
            _j_3 = pvVar10->X;
            local_d8 = pvVar10->Y;
            std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
            push_back(&this->m_normals,(value_type *)&j_3);
          }
          if (pPStack_48->m_endtype == etClosedPolygon) {
            k_1 = X._4_4_ + -1;
            for (j_4 = 0; j_4 < X._4_4_; j_4 = j_4 + 1) {
              OffsetPoint(this,j_4,&k_1,pPStack_48->m_jointype);
            }
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(&this->m_destPolys,&this->m_destPoly);
          }
          else if (pPStack_48->m_endtype == etClosedLine) {
            n.Y._4_4_ = X._4_4_ + -1;
            for (n.Y._0_4_ = 0; n.Y._0_4_ < X._4_4_; n.Y._0_4_ = n.Y._0_4_ + 1) {
              OffsetPoint(this,n.Y._0_4_,(int *)((long)&n.Y + 4),pPStack_48->m_jointype);
            }
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(&this->m_destPolys,&this->m_destPoly);
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::clear
                      (&this->m_destPoly);
            pvVar10 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ::operator[](&this->m_normals,(long)(X._4_4_ + -1));
            dStack_100 = pvVar10->X;
            n.X = pvVar10->Y;
            iVar2 = X._4_4_;
            while (local_104 = iVar2 + -1, 0 < local_104) {
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)(iVar2 + -2));
              dVar11 = pvVar10->X;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)(local_104 + -1));
              DoublePoint::DoublePoint(&local_118,-dVar11,-pvVar10->Y);
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)local_104);
              pvVar10->X = local_118.X;
              pvVar10->Y = local_118.Y;
              iVar2 = local_104;
            }
            DoublePoint::DoublePoint((DoublePoint *)&k_2,-dStack_100,-n.X);
            pvVar10 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ::operator[](&this->m_normals,0);
            pvVar10->X = _k_2;
            pvVar10->Y = local_120;
            n.Y._4_4_ = 0;
            j_7 = X._4_4_;
            while (j_7 = j_7 + -1, -1 < j_7) {
              OffsetPoint(this,j_7,(int *)((long)&n.Y + 4),pPStack_48->m_jointype);
            }
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(&this->m_destPolys,&this->m_destPoly);
          }
          else {
            local_130 = 0;
            for (pt1.Y._4_4_ = 1; pt1.Y._4_4_ < X._4_4_ + -1; pt1.Y._4_4_ = pt1.Y._4_4_ + 1) {
              OffsetPoint(this,pt1.Y._4_4_,&local_130,pPStack_48->m_jointype);
            }
            IntPoint::IntPoint((IntPoint *)auStack_148,0,0);
            if (pPStack_48->m_endtype == etOpenButt) {
              local_14c = X._4_4_ + -1;
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,(long)local_14c);
              lVar1 = pvVar6->X;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)local_14c);
              cVar7 = Round(pvVar10->X * dStack_18 + (double)lVar1);
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,(long)local_14c);
              lVar1 = pvVar6->Y;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)local_14c);
              cVar8 = Round(pvVar10->Y * dStack_18 + (double)lVar1);
              IntPoint::IntPoint(&local_160,cVar7,cVar8);
              _auStack_148 = local_160.X;
              pt1.X = local_160.Y;
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (&this->m_destPoly,(value_type *)auStack_148);
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,(long)local_14c);
              lVar1 = pvVar6->X;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)local_14c);
              cVar7 = Round(-pvVar10->X * dStack_18 + (double)lVar1);
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,(long)local_14c);
              lVar1 = pvVar6->Y;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)local_14c);
              cVar8 = Round(-pvVar10->Y * dStack_18 + (double)lVar1);
              IntPoint::IntPoint((IntPoint *)auStack_170,cVar7,cVar8);
              _auStack_148 = _auStack_170;
              pt1.X = local_168;
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (&this->m_destPoly,(value_type *)auStack_148);
              iVar2 = X._4_4_;
            }
            else {
              local_174 = X._4_4_ + -1;
              local_130 = X._4_4_ + -2;
              this->m_sinA = 0.0;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)local_174);
              dVar11 = pvVar10->X;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)local_174);
              DoublePoint::DoublePoint((DoublePoint *)auStack_188,-dVar11,-pvVar10->Y);
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)local_174);
              pvVar10->X = _auStack_188;
              pvVar10->Y = local_180;
              if (pPStack_48->m_endtype == etOpenSquare) {
                DoSquare(this,local_174,local_130);
                iVar2 = X._4_4_;
              }
              else {
                DoRound(this,local_174,local_130);
                iVar2 = X._4_4_;
              }
            }
            while (local_18c = iVar2 + -1, 0 < local_18c) {
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)(iVar2 + -2));
              dVar11 = pvVar10->X;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)(local_18c + -1));
              DoublePoint::DoublePoint(&local_1a0,-dVar11,-pvVar10->Y);
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,(long)local_18c);
              pvVar10->X = local_1a0.X;
              pvVar10->Y = local_1a0.Y;
              iVar2 = local_18c;
            }
            pvVar10 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ::operator[](&this->m_normals,1);
            dVar11 = pvVar10->X;
            pvVar10 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ::operator[](&this->m_normals,1);
            DoublePoint::DoublePoint((DoublePoint *)auStack_1b0,-dVar11,-pvVar10->Y);
            pvVar10 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ::operator[](&this->m_normals,0);
            pvVar10->X = _auStack_1b0;
            pvVar10->Y = local_1a8;
            local_130 = X._4_4_ + -1;
            for (local_1b4 = X._4_4_ + -2; 0 < local_1b4; local_1b4 = local_1b4 + -1) {
              OffsetPoint(this,local_1b4,&local_130,pPStack_48->m_jointype);
            }
            if (pPStack_48->m_endtype == etOpenButt) {
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,0);
              lVar1 = pvVar6->X;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,0);
              cVar7 = Round(-pvVar10->X * dStack_18 + (double)lVar1);
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,0);
              lVar1 = pvVar6->Y;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,0);
              cVar8 = Round(-pvVar10->Y * dStack_18 + (double)lVar1);
              IntPoint::IntPoint(&local_1c8,cVar7,cVar8);
              _auStack_148 = local_1c8.X;
              pt1.X = local_1c8.Y;
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (&this->m_destPoly,(value_type *)auStack_148);
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,0);
              lVar1 = pvVar6->X;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,0);
              cVar7 = Round(pvVar10->X * dStack_18 + (double)lVar1);
              pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                       operator[](&this->m_srcPoly,0);
              lVar1 = pvVar6->Y;
              pvVar10 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->m_normals,0);
              cVar8 = Round(pvVar10->Y * dStack_18 + (double)lVar1);
              IntPoint::IntPoint(&local_1d8,cVar7,cVar8);
              _auStack_148 = local_1d8.X;
              pt1.X = local_1d8.Y;
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (&this->m_destPoly,(value_type *)auStack_148);
            }
            else {
              local_130 = 1;
              this->m_sinA = 0.0;
              if (pPStack_48->m_endtype == etOpenSquare) {
                DoSquare(this,0,1);
              }
              else {
                DoRound(this,0,1);
              }
            }
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(&this->m_destPolys,&this->m_destPoly);
          }
        }
      }
    }
  }
  else {
    iVar2 = PolyNode::ChildCount(&this->m_polyNodes);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::reserve(&this->m_destPolys,(long)iVar2);
    for (node._4_4_ = 0; iVar2 = node._4_4_, iVar3 = PolyNode::ChildCount(&this->m_polyNodes),
        iVar2 < iVar3; node._4_4_ = node._4_4_ + 1) {
      ppPVar4 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
                operator[](&(this->m_polyNodes).Childs,(long)node._4_4_);
      y = (double)*ppPVar4;
      if (((value_type)y)->m_endtype == etClosedPolygon) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back(&this->m_destPolys,&((value_type)y)->Contour);
      }
    }
  }
  return;
}

Assistant:

void ClipperOffset::DoOffset(double delta)
{
  m_destPolys.clear();
  m_delta = delta;

  //if Zero offset, just copy any CLOSED polygons to m_p and return ...
  if (NEAR_ZERO(delta)) 
  {
    m_destPolys.reserve(m_polyNodes.ChildCount());
    for (int i = 0; i < m_polyNodes.ChildCount(); i++)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedPolygon)
        m_destPolys.push_back(node.Contour);
    }
    return;
  }

  //see offset_triginometry3.svg in the documentation folder ...
  if (MiterLimit > 2) m_miterLim = 2/(MiterLimit * MiterLimit);
  else m_miterLim = 0.5;

  double y;
  if (ArcTolerance <= 0.0) y = def_arc_tolerance;
  else if (ArcTolerance > std::fabs(delta) * def_arc_tolerance) 
    y = std::fabs(delta) * def_arc_tolerance;
  else y = ArcTolerance;
  //see offset_triginometry2.svg in the documentation folder ...
  double steps = pi / std::acos(1 - y / std::fabs(delta));
  if (steps > std::fabs(delta) * pi) 
    steps = std::fabs(delta) * pi;  //ie excessive precision check
  m_sin = std::sin(two_pi / steps);
  m_cos = std::cos(two_pi / steps);
  m_StepsPerRad = steps / two_pi;
  if (delta < 0.0) m_sin = -m_sin;

  m_destPolys.reserve(m_polyNodes.ChildCount() * 2);
  for (int i = 0; i < m_polyNodes.ChildCount(); i++)
  {
    PolyNode& node = *m_polyNodes.Childs[i];
    m_srcPoly = node.Contour;

    int len = (int)m_srcPoly.size();
    if (len == 0 || (delta <= 0 && (len < 3 || node.m_endtype != etClosedPolygon)))
        continue;

    m_destPoly.clear();
    if (len == 1)
    {
      if (node.m_jointype == jtRound)
      {
        double X = 1.0, Y = 0.0;
        for (cInt j = 1; j <= steps; j++)
        {
          m_destPoly.push_back(IntPoint(
            Round(m_srcPoly[0].X + X * delta),
            Round(m_srcPoly[0].Y + Y * delta)));
          double X2 = X;
          X = X * m_cos - m_sin * Y;
          Y = X2 * m_sin + Y * m_cos;
        }
      }
      else
      {
        double X = -1.0, Y = -1.0;
        for (int j = 0; j < 4; ++j)
        {
          m_destPoly.push_back(IntPoint(
            Round(m_srcPoly[0].X + X * delta),
            Round(m_srcPoly[0].Y + Y * delta)));
          if (X < 0) X = 1;
          else if (Y < 0) Y = 1;
          else X = -1;
        }
      }
      m_destPolys.push_back(m_destPoly);
      continue;
    }
    //build m_normals ...
    m_normals.clear();
    m_normals.reserve(len);
    for (int j = 0; j < len - 1; ++j)
      m_normals.push_back(GetUnitNormal(m_srcPoly[j], m_srcPoly[j + 1]));
    if (node.m_endtype == etClosedLine || node.m_endtype == etClosedPolygon)
      m_normals.push_back(GetUnitNormal(m_srcPoly[len - 1], m_srcPoly[0]));
    else
      m_normals.push_back(DoublePoint(m_normals[len - 2]));

    if (node.m_endtype == etClosedPolygon)
    {
      int k = len - 1;
      for (int j = 0; j < len; ++j)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
    }
    else if (node.m_endtype == etClosedLine)
    {
      int k = len - 1;
      for (int j = 0; j < len; ++j)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
      m_destPoly.clear();
      //re-build m_normals ...
      DoublePoint n = m_normals[len -1];
      for (int j = len - 1; j > 0; j--)
        m_normals[j] = DoublePoint(-m_normals[j - 1].X, -m_normals[j - 1].Y);
      m_normals[0] = DoublePoint(-n.X, -n.Y);
      k = 0;
      for (int j = len - 1; j >= 0; j--)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
    }
    else
    {
      int k = 0;
      for (int j = 1; j < len - 1; ++j)
        OffsetPoint(j, k, node.m_jointype);

      IntPoint pt1;
      if (node.m_endtype == etOpenButt)
      {
        int j = len - 1;
        pt1 = IntPoint((cInt)Round(m_srcPoly[j].X + m_normals[j].X *
          delta), (cInt)Round(m_srcPoly[j].Y + m_normals[j].Y * delta));
        m_destPoly.push_back(pt1);
        pt1 = IntPoint((cInt)Round(m_srcPoly[j].X - m_normals[j].X *
          delta), (cInt)Round(m_srcPoly[j].Y - m_normals[j].Y * delta));
        m_destPoly.push_back(pt1);
      }
      else
      {
        int j = len - 1;
        k = len - 2;
        m_sinA = 0;
        m_normals[j] = DoublePoint(-m_normals[j].X, -m_normals[j].Y);
        if (node.m_endtype == etOpenSquare)
          DoSquare(j, k);
        else
          DoRound(j, k);
      }

      //re-build m_normals ...
      for (int j = len - 1; j > 0; j--)
        m_normals[j] = DoublePoint(-m_normals[j - 1].X, -m_normals[j - 1].Y);
      m_normals[0] = DoublePoint(-m_normals[1].X, -m_normals[1].Y);

      k = len - 1;
      for (int j = k - 1; j > 0; --j) OffsetPoint(j, k, node.m_jointype);

      if (node.m_endtype == etOpenButt)
      {
        pt1 = IntPoint((cInt)Round(m_srcPoly[0].X - m_normals[0].X * delta),
          (cInt)Round(m_srcPoly[0].Y - m_normals[0].Y * delta));
        m_destPoly.push_back(pt1);
        pt1 = IntPoint((cInt)Round(m_srcPoly[0].X + m_normals[0].X * delta),
          (cInt)Round(m_srcPoly[0].Y + m_normals[0].Y * delta));
        m_destPoly.push_back(pt1);
      }
      else
      {
        k = 1;
        m_sinA = 0;
        if (node.m_endtype == etOpenSquare)
          DoSquare(0, 1);
        else
          DoRound(0, 1);
      }
      m_destPolys.push_back(m_destPoly);
    }
  }
}